

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O2

future<void> __thiscall
ThreadPool::enqueue<std::_Bind<void(*(int*))(int*)>>
          (ThreadPool *this,_Bind<void_(*(int_*))(int_*)> *f)

{
  runtime_error *this_00;
  undefined8 *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  future<void> fVar1;
  shared_ptr<std::packaged_task<void_()>_> task;
  __shared_ptr<std::packaged_task<void_()>,_(__gnu_cxx::_Lock_policy)2> local_48;
  unique_lock<std::mutex> lock;
  
  lock._M_device = (mutex_type *)*in_RDX;
  lock._8_8_ = in_RDX[1];
  std::make_shared<std::packaged_task<void()>,std::_Bind<std::_Bind<void(*(int*))(int*)>()>>
            ((_Bind<std::_Bind<void_(*(int_*))(int_*)>_()> *)&task);
  std::packaged_task<void_()>::get_future((packaged_task<void_()> *)this);
  std::unique_lock<std::mutex>::unique_lock(&lock,(mutex_type *)&f[6]._M_bound_args);
  if (*(char *)&f[0x11]._M_bound_args.super__Tuple_impl<0UL,_int_*>.
                super__Head_base<0UL,_int_*,_false>._M_head_impl != '\x01') {
    std::__shared_ptr<std::packaged_task<void_()>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_48,
               &task.super___shared_ptr<std::packaged_task<void_()>,_(__gnu_cxx::_Lock_policy)2>);
    std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
    emplace_back<ThreadPool::enqueue<std::_Bind<void(*(int*))(int*)>>(std::_Bind<void(*(int*))(int*)>&&)::_lambda()_1_>
              ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)
               &f[1]._M_bound_args,(anon_class_16_1_8991e283 *)&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    std::unique_lock<std::mutex>::~unique_lock(&lock);
    std::condition_variable::notify_one();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&task.super___shared_ptr<std::packaged_task<void_()>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    fVar1.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    fVar1.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (future<void>)
           fVar1.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"enqueue on stopped ThreadPool");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto ThreadPool::enqueue(F&& f, Args&&... args)
    -> std::future<typename std::result_of<F(Args...)>::type> {
  using return_type = typename std::result_of<F(Args...)>::type;
  auto task = std::make_shared< std::packaged_task<return_type()> >(
    std::bind(std::forward<F>(f), std::forward<Args>(args)...)
  );
  std::future<return_type> res = task->get_future();
  {
    std::unique_lock<std::mutex> lock(queue_mutex);
    // don't allow enqueueing after stopping the pool
    if (stop) {
      throw std::runtime_error("enqueue on stopped ThreadPool");
    }
    tasks.emplace([task](){ (*task)(); });
  }
  condition.notify_one();
  return res;
}